

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O2

void __thiscall IntElemBoundsImp<0,_0,_0>::wakeup(IntElemBoundsImp<0,_0,_0> *this,int i,int c)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = (this->a).sz;
  if ((c & 8U) != 0 && uVar3 + 2 == i) {
    iVar2 = BoolView::getVal(&this->b);
    if (iVar2 == 0) {
      return;
    }
    uVar3 = (this->a).sz;
  }
  if (uVar3 + 1 == i && (c & 8U) != 0) {
    Tchar::operator=(&this->is_fixed,'\x01');
    Tint::operator=(&this->fixed_index,(((this->x).var)->min).v);
    this->no_min_support = false;
    this->no_max_support = false;
  }
  else if ((this->is_fixed).v == '\0') {
    if (i < (int)uVar3) {
      if (((this->min_support).v == i) &&
         ((((this->y).var)->min).v < (((this->a).data[(uint)i].var)->min).v)) {
        this->no_min_support = true;
      }
      if (((this->max_support).v != i) ||
         ((((this->y).var)->max).v <= (((this->a).data[(uint)i].var)->max).v)) goto LAB_00183a5a;
    }
    else {
      if (uVar3 + 1 != i) goto LAB_00183a5a;
      bVar1 = IntView<0>::indomain(&this->x,(long)(this->min_support).v);
      if (!bVar1) {
        this->no_min_support = true;
        Propagator::pushInQueue(&this->super_Propagator);
      }
      bVar1 = IntView<0>::indomain(&this->x,(long)(this->max_support).v);
      if (bVar1) {
        return;
      }
    }
    this->no_max_support = true;
  }
  else if ((uVar3 != i) && ((this->fixed_index).v != i)) {
    return;
  }
LAB_00183a5a:
  Propagator::pushInQueue(&this->super_Propagator);
  return;
}

Assistant:

void wakeup(int i, int c) override {
		if (i == static_cast<int>(a.size()) + 2 && ((c & EVENT_F) != 0)) {
			if (b.getVal() == 0) {
				return;
			}
		}
		if (i == static_cast<int>(a.size()) + 1 && ((c & EVENT_F) != 0)) {
			is_fixed = 1;
			fixed_index = static_cast<int>(x.getVal());
			no_min_support = no_max_support = false;
			pushInQueue();
		} else if (is_fixed != 0) {
			if (i == static_cast<int>(a.size()) || i == fixed_index) {
				pushInQueue();
			}
		} else {
			if (i < static_cast<int>(a.size())) {
				if (i == min_support && a[i].getMin() > y.getMin()) {
					no_min_support = true;
				}
				if (i == max_support && a[i].getMax() < y.getMax()) {
					no_max_support = true;
				}
				pushInQueue();
			} else if (i == static_cast<int>(a.size() + 1)) {
				if (!x.indomain(min_support)) {
					no_min_support = true;
					pushInQueue();
				}
				if (!x.indomain(max_support)) {
					no_max_support = true;
					pushInQueue();
				}
			} else {
				pushInQueue();
			}
		}
	}